

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

ArgSlot EmitArgListEnd(ParseNode *pnode,RegSlot thisLocation,RegSlot evalLocation,
                      RegSlot newTargetLocation,ByteCodeGenerator *byteCodeGenerator,
                      FuncInfo *funcInfo,size_t argIndex,ProfileId callSiteId)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  ArgSlot AVar4;
  RegSlot RVar5;
  RegSlot RVar6;
  undefined4 *puVar7;
  short sVar8;
  
  if (0xfffa < argIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1d9c,"(argIndex < Js::Constants::UShortMaxValue - maxExtraArgSlot)",
                       "Number of allowed arguments are already capped at parser level");
    if (!bVar2) goto LAB_00769549;
    *puVar7 = 0;
  }
  sVar8 = (short)argIndex;
  if (sVar8 != 0 && evalLocation != 0xffffffff) {
    if (newTargetLocation != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1da3,"(!fHasNewTarget)","!fHasNewTarget");
      if (!bVar2) goto LAB_00769549;
      *puVar7 = 0;
    }
    bVar2 = FuncInfo::IsGlobalFunction(funcInfo);
    if ((bVar2) &&
       ((((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0 ||
        ((byteCodeGenerator->flags & 0x400) == 0)))) {
      RVar5 = FuncInfo::GetEnvRegister(funcInfo);
    }
    else {
      RVar5 = funcInfo->frameDisplayRegister;
    }
    RVar5 = ByteCodeGenerator::PrependLocalScopes(byteCodeGenerator,RVar5,evalLocation,funcInfo);
    RVar6 = FuncInfo::GetEnvRegister(funcInfo);
    if ((RVar5 == RVar6) || (RVar5 == funcInfo->frameDisplayRegister)) {
      Js::ByteCodeWriter::ArgOutEnv(&byteCodeGenerator->m_writer,sVar8 + 1U);
    }
    else {
      Js::ByteCodeWriter::ArgOut<false>
                (&byteCodeGenerator->m_writer,sVar8 + 1U,RVar5,callSiteId,false);
    }
  }
  if (newTargetLocation != 0xffffffff) {
    if (evalLocation != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1dc9,"(!fIsEval)","!fIsEval");
      if (!bVar2) {
LAB_00769549:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    Js::ByteCodeWriter::ArgOut<true>
              (&byteCodeGenerator->m_writer,sVar8 + 1,newTargetLocation,callSiteId,false);
  }
  AVar3 = sVar8 + 1 +
          (ushort)(evalLocation != 0xffffffff) + (ushort)(newTargetLocation != 0xffffffff);
  AVar4 = 1;
  if (evalLocation == 0xffffffff) {
    AVar4 = AVar3;
  }
  if (pnode != (ParseNode *)0x0) {
    AVar4 = AVar3;
  }
  return AVar4;
}

Assistant:

Js::ArgSlot EmitArgListEnd(
    ParseNode *pnode,
    Js::RegSlot thisLocation,
    Js::RegSlot evalLocation,
    Js::RegSlot newTargetLocation,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    size_t argIndex,
    Js::ProfileId callSiteId)
{
    BOOL fEvalInModule = false;
    BOOL fIsEval = (evalLocation != Js::Constants::NoRegister);
    BOOL fHasNewTarget = (newTargetLocation != Js::Constants::NoRegister);

    static const size_t maxExtraArgSlot = 4;  // max(extraEvalArg, extraArg), where extraEvalArg==2 (moduleRoot,env), extraArg==4 (this, eval, evalInModule, newTarget)
    AssertOrFailFastMsg(argIndex < Js::Constants::UShortMaxValue - maxExtraArgSlot, "Number of allowed arguments are already capped at parser level");

    Js::ArgSlot argSlotIndex = (Js::ArgSlot) argIndex;
    Js::ArgSlot evalIndex;

    if (fIsEval && argSlotIndex > 0)
    {
        Assert(!fHasNewTarget);

        // Pass the frame display as an extra argument to "eval".
        // Do this only if eval is called with some args
        Js::RegSlot evalEnv;
        if (funcInfo->IsGlobalFunction() && !(funcInfo->GetIsStrictMode() && byteCodeGenerator->GetFlags() & fscrEval))
        {
            // Use current environment as the environment for the function being called when:
            // - this is the root global function (not an eval's global function)
            // - this is an eval's global function that is not in strict mode (see else block)
            evalEnv = funcInfo->GetEnvRegister();
        }
        else
        {
            // Use the frame display as the environment for the function being called when:
            // - this is not a global function and thus it will have its own scope
            // - this is an eval's global function that is in strict mode, since in strict mode the eval's global function
            //   has its own scope
            evalEnv = funcInfo->frameDisplayRegister;
        }

        evalEnv = byteCodeGenerator->PrependLocalScopes(evalEnv, evalLocation, funcInfo);

        // Passing the FrameDisplay as an extra argument
        evalIndex = argSlotIndex + 1;

        if (evalEnv == funcInfo->GetEnvRegister() || evalEnv == funcInfo->frameDisplayRegister)
        {
            byteCodeGenerator->Writer()->ArgOutEnv(evalIndex);
        }
        else
        {
            byteCodeGenerator->Writer()->ArgOut<false>(evalIndex, evalEnv, callSiteId, false /*emitProfiledArgout*/);
        }
    }

    if (fHasNewTarget)
    {
        Assert(!fIsEval);

        byteCodeGenerator->Writer()->ArgOut<true>(argSlotIndex + 1, newTargetLocation, callSiteId, false /*emitProfiledArgout*/);
    }

    Js::ArgSlot argIntCount = argSlotIndex + 1 + (Js::ArgSlot)fIsEval + (Js::ArgSlot)fEvalInModule + (Js::ArgSlot)fHasNewTarget;

    // eval and no args passed, return 1 as argument count
    if (fIsEval && pnode == nullptr)
    {
        return 1;
    }

    return argIntCount;
}